

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ArgBuilder __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::operator[](CommandLine<Catch::ConfigData> *this)

{
  pointer pAVar1;
  logic_error *this_00;
  Arg *this_01;
  unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  local_38 [3];
  CommandLine<Catch::ConfigData> *local_20;
  CommandLine<Catch::ConfigData> *this_local;
  ArgBuilder local_10;
  ArgBuilder builder;
  
  local_20 = this;
  pAVar1 = std::
           unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ::get(&this->m_floatingArg);
  if (pAVar1 != (pointer)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Only one unpositional argument can be added");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_01 = (Arg *)operator_new(0xa8);
  Arg::Arg(this_01);
  std::
  unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>>
  ::unique_ptr<std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>,void>
            ((unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>>
              *)local_38,this_01);
  std::
  unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::operator=(&this->m_floatingArg,local_38);
  std::
  unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::~unique_ptr(local_38);
  pAVar1 = std::
           unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ::get(&this->m_floatingArg);
  ArgBuilder::ArgBuilder(&local_10,pAVar1);
  return (ArgBuilder)local_10.m_arg;
}

Assistant:

ArgBuilder operator[]( UnpositionalTag ) {
            if( m_floatingArg.get() )
                throw std::logic_error( "Only one unpositional argument can be added" );
            m_floatingArg = ArgAutoPtr( new Arg() );
            ArgBuilder builder( m_floatingArg.get() );
            return builder;
        }